

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::_draw_text<unsigned_char,unsigned_char,unsigned_char>
          (CImg<unsigned_char> *this,int x0,int y0,char *text,uchar *foreground_color,
          uchar *background_color,float opacity,CImgList<unsigned_char> *font,bool is_native_font)

{
  byte bVar1;
  uchar value;
  size_t sVar2;
  CImg<unsigned_char> *pCVar3;
  CImgArgumentException *this_00;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  bool bVar11;
  CImg<unsigned_char> letter;
  CImg<unsigned_char> local_50;
  
  if (text != (char *)0x0) {
    pCVar3 = font->_data;
    if (pCVar3 == (CImg<unsigned_char> *)0x0) {
      this_00 = (CImgArgumentException *)__cxa_allocate_exception(0x4008);
      pcVar9 = "non-";
      if (this->_is_shared != false) {
        pcVar9 = "";
      }
      CImgArgumentException::CImgArgumentException
                (this_00,
                 "[instance(%u,%u,%u,%u,%p,%sshared)] CImg<%s>::draw_text(): Empty specified font.",
                 (ulong)this->_width,(ulong)this->_height,(ulong)this->_depth,(ulong)this->_spectrum
                 ,this->_data,pcVar9,"unsigned char");
      __cxa_throw(this_00,&CImgArgumentException::typeinfo,std::exception::~exception);
    }
    sVar2 = strlen(text);
    if ((((this->_data == (uchar *)0x0) || (this->_width == 0)) || (this->_height == 0)) ||
       ((this->_depth == 0 || (this->_spectrum == 0)))) {
      if ((int)sVar2 == 0) {
        iVar10 = 0;
        iVar4 = 0;
        iVar7 = 0;
        bVar11 = false;
      }
      else {
        uVar8 = 0;
        iVar7 = 0;
        iVar4 = 0;
        iVar10 = 0;
        do {
          bVar1 = text[uVar8];
          if (bVar1 == 9) {
            iVar10 = iVar10 + pCVar3[0x20]._width * 4;
          }
          else if (bVar1 == 10) {
            iVar4 = iVar4 + pCVar3->_height;
            if (iVar7 < iVar10) {
              iVar7 = iVar10;
            }
            iVar10 = 0;
          }
          else if ((uint)bVar1 < font->_width) {
            iVar10 = iVar10 + pCVar3[bVar1]._width;
          }
          uVar8 = uVar8 + 1;
        } while ((sVar2 & 0xffffffff) != uVar8);
        bVar11 = bVar1 == 10;
      }
      if ((iVar10 != 0) || (bVar11)) {
        if (iVar7 < iVar10) {
          iVar7 = iVar10;
        }
        iVar4 = iVar4 + pCVar3->_height;
      }
      uVar5 = 1;
      if (!is_native_font) {
        uVar5 = pCVar3->_spectrum;
      }
      pCVar3 = assign(this,iVar7 + x0,iVar4 + y0,1,uVar5);
      fill(pCVar3,'\0');
    }
    if ((int)sVar2 != 0) {
      uVar8 = 0;
      iVar10 = x0;
      do {
        bVar1 = text[uVar8];
        if (bVar1 == 9) {
          iVar10 = iVar10 + font->_data[0x20]._width * 4;
        }
        else if (bVar1 == 10) {
          y0 = y0 + font->_data->_height;
          iVar10 = x0;
        }
        else if ((uint)bVar1 < font->_width) {
          CImg(&letter,font->_data + bVar1);
          if (letter._data != (uchar *)0x0) {
            if (is_native_font) {
              if (letter._spectrum < this->_spectrum) {
                resize(&letter,-100,-100,1,this->_spectrum,0,2,0.0,0.0,0.0,0.0);
              }
            }
            uVar5 = letter._spectrum;
            if (this->_spectrum < letter._spectrum) {
              uVar5 = this->_spectrum;
            }
            if (uVar5 != 0 && foreground_color != (uchar *)0x0) {
              uVar6 = 0;
              do {
                value = foreground_color[uVar6];
                if (value != '\x01') {
                  get_shared_channels(&local_50,&letter,(uint)uVar6,(uint)uVar6);
                  operator*=(&local_50,value);
                  if ((local_50._is_shared == false) && (local_50._data != (uchar *)0x0)) {
                    operator_delete__(local_50._data);
                  }
                }
                uVar6 = uVar6 + 1;
              } while (uVar5 != uVar6);
            }
            if ((int)(bVar1 | 0x100) < (int)font->_width) {
              if (uVar5 != 0 && background_color != (uchar *)0x0) {
                uVar6 = 0;
                do {
                  draw_rectangle(this,iVar10,y0,0,(int)uVar6,letter._width + iVar10 + -1,
                                 letter._height + y0 + -1,0,(int)uVar6,background_color[uVar6],
                                 opacity);
                  uVar6 = uVar6 + 1;
                } while (uVar5 != uVar6);
              }
              draw_image<unsigned_char,unsigned_char>
                        (this,iVar10,y0,0,0,&letter,
                         (CImg<unsigned_char> *)
                         ((long)&font->_data->_width + (ulong)((bVar1 | 0x100) << 5)),opacity,255.0)
              ;
            }
            else {
              draw_image(this,iVar10,y0,0,0,&letter,opacity);
            }
            iVar10 = iVar10 + letter._width;
          }
          if ((letter._is_shared == false) && (letter._data != (uchar *)0x0)) {
            operator_delete__(letter._data);
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 != (sVar2 & 0xffffffff));
    }
  }
  return this;
}

Assistant:

CImg<T>& _draw_text(const int x0, const int y0,
                        const char *const text,
                        const tc1 *const foreground_color, const tc2 *const background_color,
                        const float opacity, const CImgList<t>& font,
                        const bool is_native_font) {
      if (!text) return *this;
      if (!font)
        throw CImgArgumentException(_cimg_instance
                                    "draw_text(): Empty specified font.",
                                    cimg_instance);

      const unsigned int text_length = (unsigned int)std::strlen(text);
      const bool _is_empty = is_empty();
      if (_is_empty) {
        // If needed, pre-compute necessary size of the image
        int x = 0, y = 0, w = 0;
        unsigned char c = 0;
        for (unsigned int i = 0; i<text_length; ++i) {
          c = text[i];
          switch (c) {
          case '\n' : y+=font[0]._height; if (x>w) w = x; x = 0; break;
          case '\t' : x+=4*font[' ']._width; break;
          default : if (c<font._width) x+=font[c]._width;
          }
        }
        if (x!=0 || c=='\n') {
          if (x>w) w=x;
          y+=font[0]._height;
        }
        assign(x0+w,y0+y,1,is_native_font?1:font[0]._spectrum,0);
      }

      int x = x0, y = y0;
      for (unsigned int i = 0; i<text_length; ++i) {
        const unsigned char c = text[i];
        switch (c) {
        case '\n' : y+=font[0]._height; x = x0; break;
        case '\t' : x+=4*font[' ']._width; break;
        default : if (c<font._width) {
            CImg<T> letter = font[c];
            if (letter) {
              if (is_native_font && _spectrum>letter._spectrum) letter.resize(-100,-100,1,_spectrum,0,2);
              const unsigned int cmin = cimg::min(_spectrum,letter._spectrum);
              if (foreground_color) for (unsigned int c = 0; c<cmin; ++c) if (foreground_color[c]!=1) letter.get_shared_channel(c)*=foreground_color[c];
              if (c+256<font.width()) { // Letter has mask.
                if (background_color) for (unsigned int c = 0; c<cmin; ++c) draw_rectangle(x,y,0,c,x+letter._width-1,y+letter._height-1,0,c,background_color[c],opacity);
                draw_image(x,y,letter,font[c+256],opacity,(T)255);
              } else draw_image(x,y,letter,opacity); // Letter has no mask.
              x+=letter._width;
            }
          }
        }
      }
      return *this;
    }